

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O2

sarimax_wrapper_object
sarimax_wrapper(sarimax_wrapper_object model,double *y,int N,int *order,int *seasonal,double *xreg,
               int r,int idrift,int mean,double *lambda,int biasadj,int method)

{
  size_t __size;
  int iVar1;
  int p;
  int q;
  uint uVar2;
  double *bxcx;
  sarimax_wrapper_object psVar3;
  double *xreg_00;
  sarimax_object obj;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  int local_40;
  int local_3c;
  
  __size = (long)N * 8;
  bxcx = (double *)malloc(__size);
  psVar3 = (sarimax_wrapper_object)malloc(0x38);
  memcpy(bxcx,y,__size);
  if (lambda != (double *)0x0) {
    boxcox_eval(y,N,*lambda,bxcx);
  }
  if (model == (sarimax_wrapper_object)0x0) {
    iVar1 = order[1];
    if (seasonal == (int *)0x0) {
      iVar6 = 0;
      local_40 = 0;
      iVar7 = 0;
      local_3c = 0;
    }
    else {
      local_3c = *seasonal;
      iVar6 = seasonal[1];
      local_40 = seasonal[2];
      iVar7 = seasonal[3];
    }
    p = *order;
    q = order[2];
    if (iVar1 + iVar6 < 2 && idrift == 1) {
      psVar3->idrift = 1;
      xreg_00 = (double *)malloc((long)(r + 1) * __size);
      uVar4 = 0;
      uVar5 = 0;
      if (0 < N) {
        uVar4 = (ulong)(uint)N;
      }
      while (uVar4 != uVar5) {
        xreg_00[uVar5] = (double)(int)(uVar5 + 1);
        uVar5 = uVar5 + 1;
      }
      memcpy(xreg_00 + N,xreg,__size * (long)r);
      r = r + 1;
    }
    else {
      xreg_00 = (double *)malloc(__size * (long)r);
      memcpy(xreg_00,xreg,__size * (long)r);
    }
    obj = sarimax_init(p,iVar1,q,local_3c,iVar6,local_40,iVar7,r,mean,N);
    psVar3->sarimax = obj;
    sarimax_exec(obj,bxcx,xreg_00);
    dVar9 = obj->aic;
    psVar3->aic = dVar9;
    iVar6 = obj->q + obj->p + obj->P + obj->Q;
    iVar1 = obj->M;
    iVar7 = iVar6 + iVar1;
    dVar8 = (double)obj->Nused;
    psVar3->aicc = (dVar8 / (double)((obj->Nused - iVar7) + -2) + -1.0) * (double)(iVar7 * 2 + 2) +
                   dVar9;
    dVar8 = log(dVar8);
    psVar3->bic = (dVar8 + -2.0) * (double)(iVar1 + iVar6 + 1) + dVar9;
    uVar2 = obj->Nused;
    uVar5 = 0;
    uVar4 = 0;
    if (0 < (int)uVar2) {
      uVar4 = (ulong)uVar2;
    }
    dVar9 = 0.0;
    for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      dVar9 = dVar9 + obj->res[uVar5] * obj->res[uVar5];
    }
    psVar3->sigma2 = dVar9 / (double)(int)(uVar2 - iVar7);
    free(xreg_00);
  }
  free(bxcx);
  return psVar3;
}

Assistant:

sarimax_wrapper_object sarimax_wrapper(sarimax_wrapper_object model,double *y, int N,int *order, int *seasonal, double *xreg, int r, int idrift,int mean,
	double *lambda, int biasadj,int method) {
	/*
	Init here. { sarimax_object,drift}
	*/
	sarimax_wrapper_object obj = NULL;
	int i, p,d,q,P,D,Q,s,ncoeff,drift,rr;
	double *x, *origx,*xreg2;
	double rsum;

	x = (double*) malloc(sizeof(double)*N);
	origx = (double*) malloc(sizeof(double)*N);
	obj = (sarimax_wrapper_object) malloc (sizeof(struct sarimax_wrapper_set));

	memcpy(x,y,sizeof(double)*N);
	memcpy(origx,y,sizeof(double)*N);

	if (lambda != NULL) boxcox_eval(y,N,*lambda,x);

	if (seasonal == NULL) {
		P = D = Q = s = 0;
	}


	if (model == NULL) {
		p = order[0];
		d = order[1];
		q = order[2];
		if (seasonal != NULL) {
			P = seasonal[0];
			D = seasonal[1];
			Q = seasonal[2];
			s = seasonal[3];
		}

		if (idrift == 1) {
			drift = 1;
		} else {
			drift = 0;
		}

		if (d + D > 1 && idrift == 1) {
			drift = 0;
		}

		//printf("drift %d \n",drift);

		rr = r;

		
		if (drift == 1) {
			obj->idrift = 1;
			rr++;
			xreg2 = (double*)malloc(sizeof(double)*N*rr);
			for(i = 0; i < N;++i) {
				xreg2[i] = (double) (i+1);
			}
			memcpy(xreg2+N,xreg,sizeof(double)*N*(rr-1));
		} else {
			xreg2 = (double*)malloc(sizeof(double)*N*rr);
			memcpy(xreg2,xreg,sizeof(double)*N*rr);
		}
		
		obj->sarimax = sarimax_init(p,d,q,P,D,Q,s,rr,mean,N);

		sarimax_exec(obj->sarimax,x,xreg2);
		obj->aic = obj->sarimax->aic;
		ncoeff = (obj->sarimax->p + obj->sarimax->q + obj->sarimax->P + obj->sarimax->Q + obj->sarimax->M) + 1;
		obj->aicc = obj->aic + 2 * ncoeff * ((double)obj->sarimax->Nused / (double) (obj->sarimax->Nused - ncoeff - 1) - 1.0);
		obj->bic = obj->aic + ncoeff * (log((double)obj->sarimax->Nused) - 2.0);
		
		rsum = 0.0;

		for(i = 0; i < obj->sarimax->Nused;++i) {
			rsum += obj->sarimax->res[i]*obj->sarimax->res[i];
		}

		obj->sigma2 = rsum / (double) (obj->sarimax->Nused - ncoeff + 1);
		
		/// memory leak fix
		free(xreg2);

	}

	free(x);
	free(origx);

	return obj;
}